

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O3

int Am_Font_Data::remove(char *__filename)

{
  Am_Font_Data **ppAVar1;
  Am_Font_Data *pAVar2;
  Am_Font_Data *pAVar3;
  
  ppAVar1 = &list;
  if (list == (Am_Font_Data *)0x0) {
    return 0x2f6590;
  }
  pAVar2 = list;
  if (list == (Am_Font_Data *)__filename) {
    pAVar3 = (Am_Font_Data *)0x0;
  }
  else {
    do {
      pAVar3 = pAVar2;
      pAVar2 = pAVar3->next;
      if (pAVar2 == (Am_Font_Data *)0x0) {
        return 0x2f6590;
      }
    } while (pAVar2 != (Am_Font_Data *)__filename);
  }
  if (pAVar3 != (Am_Font_Data *)0x0) {
    ppAVar1 = &pAVar3->next;
  }
  *ppAVar1 = pAVar2->next;
  return (int)ppAVar1;
}

Assistant:

void
Am_Font_Data::remove(Am_Font_Data *font)
{
  Am_Font_Data *prev = nullptr;
  Am_Font_Data *curr = list;
  while (curr) {
    if (curr == font) {
      if (prev)
        prev->next = curr->next;
      else
        list = curr->next;
      return;
    }
    prev = curr;
    curr = curr->next;
  }
}